

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O3

void Min_SopDist1Merge(Min_Man_t *p)

{
  uint *__s;
  Min_Cube_t **ppMVar1;
  bool bVar2;
  uint uVar3;
  Min_Cube_t *pMVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  Min_Cube_t *pCube;
  Min_Cube_t *pCube_00;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar16 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  lVar9 = (long)p->nVars;
  if (-1 < lVar9) {
    do {
      for (pCube_00 = p->ppStore[lVar9];
          (pCube_00 != (Min_Cube_t *)0x0 && (pCube = pCube_00->pNext, pCube != (Min_Cube_t *)0x0));
          pCube_00 = pCube_00->pNext) {
        do {
          uVar3 = *(uint *)&pCube->field_0x8 ^ *(uint *)&pCube_00->field_0x8;
          if (0x3fffff < uVar3) {
            __assert_fail("pCube->nLits == pCube2->nLits",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1f7,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          uVar7 = *(uint *)&pCube_00->field_0x8 >> 10 & 0xfff;
          if (uVar7 == 0) {
LAB_003d339d:
            putchar(10);
            Min_CubeWrite(_stdout,pCube_00);
            Min_CubeWrite(_stdout,pCube);
            puts("Error: Min_CubesDistOne() looks at two equal cubes!");
            uVar3 = *(uint *)&pCube->field_0x8 ^ *(uint *)&pCube_00->field_0x8;
          }
          else {
            bVar2 = true;
            uVar6 = 0;
            do {
              while( true ) {
                uVar10 = uVar6 + 1;
                if (pCube_00->uData[uVar6] == pCube->uData[uVar6]) break;
                if ((!bVar2) ||
                   (uVar11 = pCube->uData[uVar6] ^ pCube_00->uData[uVar6],
                   uVar11 = (uVar11 >> 1 | uVar11) & 0x55555555, (uVar11 & uVar11 - 1) != 0))
                goto LAB_003d355f;
                bVar2 = false;
                uVar6 = uVar10;
                if (uVar10 == uVar7) goto LAB_003d33d9;
              }
              uVar6 = uVar10;
            } while (uVar10 != uVar7);
            if (bVar2) goto LAB_003d339d;
          }
LAB_003d33d9:
          if ((uVar3 & 0x3ff) != 0) {
            __assert_fail("pCube0->nVars == pCube1->nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                          ,0x1e3,"Min_Cube_t *Min_CubesXor(Min_Man_t *, Min_Cube_t *, Min_Cube_t *)"
                         );
          }
          pMVar4 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
          pMVar4->pNext = (Min_Cube_t *)0x0;
          uVar7 = p->nVars & 0x3ff;
          *(uint *)&pMVar4->field_0x8 = *(uint *)&pMVar4->field_0x8 & 0xfffffc00 | uVar7;
          uVar3 = p->nWords;
          uVar7 = (uVar3 & 0xfff) << 10 | uVar7;
          *(uint *)&pMVar4->field_0x8 = uVar7;
          __s = pMVar4->uData;
          memset(__s,0xff,(long)p->nWords << 2);
          if (0 < p->nWords) {
            lVar5 = 0;
            do {
              __s[lVar5] = pCube->uData[lVar5] ^ pCube_00->uData[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 < p->nWords);
          }
          if ((uVar3 & 0xfff) == 0) {
            uVar3 = 0;
          }
          else {
            uVar6 = 0;
            iVar12 = 0;
            do {
              uVar11 = __s[uVar6] >> 1 ^ __s[uVar6];
              iVar13 = 0;
              iVar14 = 0;
              iVar15 = 0;
              iVar8 = 0x10;
              auVar16 = _DAT_008b5e80;
              do {
                auVar20 = pshuflw(in_XMM3,auVar16,0xfe);
                lVar5 = auVar20._0_8_;
                auVar22._0_4_ = uVar11 >> lVar5;
                auVar22._4_4_ = uVar11 >> lVar5;
                auVar22._8_4_ = uVar11 >> lVar5;
                auVar22._12_4_ = uVar11 >> lVar5;
                auVar20 = pshuflw(auVar20,auVar16,0x54);
                iVar17 = auVar16._4_4_;
                iVar18 = auVar16._8_4_;
                iVar19 = auVar16._12_4_;
                auVar21._0_8_ = auVar16._8_8_;
                auVar21._8_4_ = iVar18;
                auVar21._12_4_ = iVar19;
                auVar23 = pshuflw(auVar22,auVar21,0xfe);
                in_XMM3 = pshuflw(auVar21,auVar21,0x54);
                iVar12 = iVar12 + (uVar11 >> auVar20._0_8_ & 1);
                iVar13 = iVar13 + (auVar22._4_4_ & 1);
                iVar14 = iVar14 + (uVar11 >> in_XMM3._0_8_ & 1);
                iVar15 = iVar15 + (uVar11 >> auVar23._0_8_ & 1);
                auVar16._0_4_ = auVar16._0_4_ + 8;
                auVar16._4_4_ = iVar17 + 8;
                auVar16._8_4_ = iVar18 + 8;
                auVar16._12_4_ = iVar19 + 8;
                iVar8 = iVar8 + -4;
              } while (iVar8 != 0);
              iVar12 = iVar15 + iVar13 + iVar14 + iVar12;
              uVar6 = uVar6 + 1;
            } while (uVar6 != ((ulong)uVar3 & 0xfff));
            uVar3 = iVar12 * 0x400000;
          }
          *(uint *)&pMVar4->field_0x8 = uVar7 | uVar3;
          uVar3 = uVar3 >> 0x16;
          if (uVar3 != (*(uint *)&pCube_00->field_0x8 >> 0x16) - 1) {
            __assert_fail("pCubeNew->nLits == pCube->nLits - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1fb,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          ppMVar1 = p->ppStore;
          pMVar4->pNext = ppMVar1[uVar3];
          ppMVar1[uVar3] = pMVar4;
          p->nCubes = p->nCubes + 1;
LAB_003d355f:
          pCube = pCube->pNext;
        } while (pCube != (Min_Cube_t *)0x0);
      }
      bVar2 = 0 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Min_SopDist1Merge( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pCube2, * pCubeNew;
    int i;
    for ( i = p->nVars; i >= 0; i-- )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        Min_CoverForEachCube( pCube->pNext, pCube2 )
        {
            assert( pCube->nLits == pCube2->nLits );
            if ( !Min_CubesDistOne( pCube, pCube2, NULL ) )
                continue;
            pCubeNew = Min_CubesXor( p, pCube, pCube2 );
            assert( pCubeNew->nLits == pCube->nLits - 1 );
            pCubeNew->pNext = p->ppStore[pCubeNew->nLits];
            p->ppStore[pCubeNew->nLits] = pCubeNew;
            p->nCubes++;
        }
    }
}